

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_read_shared
              (MPIABI_File fh,void *buf,int count,MPIABI_Datatype datatype,MPIABI_Status *status)

{
  void *pvVar1;
  int iVar2;
  ompi_file_t *poVar3;
  ompi_datatype_t *poVar4;
  MPI_Status *pMVar5;
  WPI_StatusPtr local_48;
  WPI_Handle local_40 [8];
  WPI_Handle local_38 [8];
  MPIABI_Status *local_30;
  MPIABI_Status *status_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_18;
  int count_local;
  void *buf_local;
  MPIABI_File fh_local;
  
  local_30 = status;
  status_local = (MPIABI_Status *)datatype;
  datatype_local._4_4_ = count;
  pvStack_18 = buf;
  buf_local = (void *)fh;
  WPI_Handle<ompi_file_t_*>::WPI_Handle((WPI_Handle<ompi_file_t_*> *)local_38,fh);
  poVar3 = WPI_Handle::operator_cast_to_ompi_file_t_(local_38);
  pvVar1 = pvStack_18;
  iVar2 = datatype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_40,(uintptr_t)status_local);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_40);
  WPI_StatusPtr::WPI_StatusPtr(&local_48,local_30);
  pMVar5 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_48);
  iVar2 = MPI_File_read_shared(poVar3,pvVar1,iVar2,poVar4,pMVar5);
  WPI_StatusPtr::~WPI_StatusPtr(&local_48);
  return iVar2;
}

Assistant:

int MPIABI_File_read_shared(
  MPIABI_File fh,
  void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Status * status
) {
  return MPI_File_read_shared(
    (MPI_File)(WPI_File)fh,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}